

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O2

void __thiscall CSocekt::clearconnection(CSocekt *this)

{
  _List_node_base *p_Var1;
  CMemory *this_00;
  list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *this_01;
  
  this_00 = CMemory::GetInstance();
  this_01 = &this->m_connectionList;
  while (p_Var1 = (this_01->
                  super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>).
                  _M_impl._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_01) {
    p_Var1 = p_Var1[1]._M_next;
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::pop_front
              (this_01);
    (**(code **)p_Var1->_M_next)(p_Var1);
    CMemory::FreeMemory(this_00,p_Var1);
  }
  return;
}

Assistant:

void CSocekt::clearconnection()
{
    lp_connection_t p_Conn;
	CMemory *p_memory = CMemory::GetInstance(); //获得单例对象的指针
	
	while(!m_connectionList.empty())
	{
		p_Conn = m_connectionList.front();
		m_connectionList.pop_front(); 
        p_Conn->~flyd_connection_t();     //手工调用析构函数
		p_memory->FreeMemory(p_Conn);
	}
}